

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::writeField(WasmBinaryWriter *this,Field *field)

{
  BufferWithRandomAccess *pBVar1;
  bool bVar2;
  bool bVar3;
  U32LEB local_34;
  uintptr_t local_30;
  S32LEB local_24;
  S32LEB local_20;
  BasicType local_1c;
  Field *local_18;
  Field *field_local;
  WasmBinaryWriter *this_local;
  
  local_1c = i32;
  local_18 = field;
  field_local = (Field *)this;
  bVar2 = wasm::Type::operator==(&field->type,&local_1c);
  bVar3 = false;
  if (bVar2) {
    bVar3 = local_18->packedType != not_packed;
  }
  if (bVar3) {
    if (local_18->packedType == i8) {
      pBVar1 = this->o;
      LEB<int,_signed_char>::LEB(&local_20,-8);
      BufferWithRandomAccess::operator<<(pBVar1,local_20);
    }
    else {
      if (local_18->packedType != i16) {
        handle_unreachable("invalid packed type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                           ,0x6e3);
      }
      pBVar1 = this->o;
      LEB<int,_signed_char>::LEB(&local_24,-9);
      BufferWithRandomAccess::operator<<(pBVar1,local_24);
    }
  }
  else {
    local_30 = (local_18->type).id;
    writeType(this,(Type)local_30);
  }
  pBVar1 = this->o;
  LEB<unsigned_int,_unsigned_char>::LEB(&local_34,local_18->mutable_);
  BufferWithRandomAccess::operator<<(pBVar1,local_34);
  return;
}

Assistant:

void WasmBinaryWriter::writeField(const Field& field) {
  if (field.type == Type::i32 && field.packedType != Field::not_packed) {
    if (field.packedType == Field::i8) {
      o << S32LEB(BinaryConsts::EncodedType::i8);
    } else if (field.packedType == Field::i16) {
      o << S32LEB(BinaryConsts::EncodedType::i16);
    } else {
      WASM_UNREACHABLE("invalid packed type");
    }
  } else {
    writeType(field.type);
  }
  o << U32LEB(field.mutable_);
}